

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementGeneric.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementGeneric::ComputeGravityForces
          (ChElementGeneric *this,ChVectorDynamic<> *Fg,ChVector<double> *G_acc)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong rows;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Index index;
  ulong uVar11;
  long lVar12;
  Index size;
  double dVar13;
  shared_ptr<chrono::ChLoadableUVW> mloadable;
  shared_ptr<chrono::ChLoad<chrono::ChLoaderGravity>_> common_gravity_loader;
  undefined1 local_49;
  shared_ptr<chrono::ChLoadableUVW> local_48;
  ChLoad<chrono::ChLoaderGravity> *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  lVar12 = (Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar12 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar12 != 0) {
    memset((Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,0,
           lVar12 << 3);
  }
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x18);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00b33a80;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)this;
  local_48.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)__dynamic_cast(this,&typeinfo,&ChLoadableUVW::typeinfo,0xfffffffffffffffe);
  if (local_48.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_48.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_48.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_48.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = this_00;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      if (local_48.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) goto LAB_006957fe;
    }
    else {
      this_00->_M_use_count = 2;
    }
    if ((((VNULL == G_acc->m_data[0]) && (!NAN(VNULL) && !NAN(G_acc->m_data[0]))) &&
        (DAT_00b689a0 == G_acc->m_data[1])) && (!NAN(DAT_00b689a0) && !NAN(G_acc->m_data[1]))) {
      if ((DAT_00b689a8 == G_acc->m_data[2]) && (!NAN(DAT_00b689a8) && !NAN(G_acc->m_data[2])))
      goto LAB_006957fe;
    }
    local_30 = (ChLoad<chrono::ChLoaderGravity> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChLoad<chrono::ChLoaderGravity>,std::allocator<chrono::ChLoad<chrono::ChLoaderGravity>>,std::shared_ptr<chrono::ChLoadableUVW>&>
              (&local_28,&local_30,(allocator<chrono::ChLoad<chrono::ChLoaderGravity>_> *)&local_49,
               &local_48);
    dVar13 = G_acc->m_data[2];
    dVar5 = G_acc->m_data[1];
    (local_30->loader).G_acc.m_data[0] = G_acc->m_data[0];
    (local_30->loader).G_acc.m_data[1] = dVar5;
    (local_30->loader).G_acc.m_data[2] = dVar13;
    (local_30->loader).num_int_points = 1;
    dVar13 = (double)(**(code **)((long)*local_48.
                                         super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + 0x70))();
    if ((dVar13 != 0.0) || (NAN(dVar13))) {
      (local_30->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
      super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_48.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(local_30->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
                  super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &local_48.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      (*(local_30->super_ChLoadBase).super_ChObj._vptr_ChObj[0xc])(local_30,0,0);
      pdVar3 = (local_30->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.super_ChLoader.Q.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      rows = (local_30->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.super_ChLoader.Q.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if ((Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
          rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows,1);
        if ((Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
            rows) {
          __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                        "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                       );
        }
      }
      pdVar4 = (Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      uVar11 = rows + 7;
      if (-1 < (long)rows) {
        uVar11 = rows;
      }
      uVar11 = uVar11 & 0xfffffffffffffff8;
      if (7 < (long)rows) {
        lVar12 = 0;
        do {
          pdVar1 = pdVar3 + lVar12;
          dVar13 = pdVar1[1];
          dVar5 = pdVar1[2];
          dVar6 = pdVar1[3];
          dVar7 = pdVar1[4];
          dVar8 = pdVar1[5];
          dVar9 = pdVar1[6];
          dVar10 = pdVar1[7];
          pdVar2 = pdVar4 + lVar12;
          *pdVar2 = *pdVar1;
          pdVar2[1] = dVar13;
          pdVar2[2] = dVar5;
          pdVar2[3] = dVar6;
          pdVar2[4] = dVar7;
          pdVar2[5] = dVar8;
          pdVar2[6] = dVar9;
          pdVar2[7] = dVar10;
          lVar12 = lVar12 + 8;
        } while (lVar12 < (long)uVar11);
      }
      if ((long)uVar11 < (long)rows) {
        do {
          pdVar4[uVar11] = pdVar3[uVar11];
          uVar11 = uVar11 + 1;
        } while (rows != uVar11);
      }
    }
    if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
    }
  }
LAB_006957fe:
  if (local_48.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return;
}

Assistant:

void ChElementGeneric::ComputeGravityForces(ChVectorDynamic<>& Fg, const ChVector<>& G_acc) {

    // A default fall-back implementation of the ComputeGravityForces that will work for all elements
    // inherited from ChLoadableUVW and with nonzero GetDensity(). You might override with more efficient implementations.

    Fg.setZero();

    // A null deleter: this is a hack to wrap "this" raw ptr, but we really need this 
    // because the ChLoaderGravity needs it as a shared pointer
    std::shared_ptr<ChElementGeneric> this_wrapper{this, [](ChElementGeneric*){} }; 

    if (auto mloadable = std::dynamic_pointer_cast<ChLoadableUVW>(this_wrapper)) {
        if (G_acc != VNULL) {
                auto common_gravity_loader = chrono_types::make_shared<ChLoad<ChLoaderGravity>>(mloadable);
                common_gravity_loader->loader.Set_G_acc(G_acc);
                common_gravity_loader->loader.SetNumIntPoints(1); //// TODO n. gauss points as parameter?
                if (mloadable->GetDensity()) {
                    // temporary set loader target and compute generalized forces term
                    common_gravity_loader->loader.loadable = mloadable;
                    common_gravity_loader->ComputeQ(nullptr, nullptr);
                    Fg = common_gravity_loader->loader.Q;
                }
        }
    }
}